

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_external_file_cache.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBExternalFileCacheInit(ClientContext *context,TableFunctionInitInput *input)

{
  ExternalFileCache *this;
  pointer pDVar1;
  _Head_base<0UL,_duckdb::DuckDBExternalFileCacheData_*,_false> local_30;
  vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_> local_28;
  
  make_uniq<duckdb::DuckDBExternalFileCacheData>();
  this = ExternalFileCache::Get((ClientContext *)input);
  ExternalFileCache::GetCachedFileInformation
            ((vector<duckdb::CachedFileInformation,_true> *)&local_28,this);
  pDVar1 = unique_ptr<duckdb::DuckDBExternalFileCacheData,_std::default_delete<duckdb::DuckDBExternalFileCacheData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBExternalFileCacheData,_std::default_delete<duckdb::DuckDBExternalFileCacheData>,_true>
                         *)&local_30);
  ::std::vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>::
  _M_move_assign(&(pDVar1->entries).
                  super_vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>
                 ,&local_28);
  ::std::vector<duckdb::CachedFileInformation,_std::allocator<duckdb::CachedFileInformation>_>::
  ~vector(&local_28);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBExternalFileCacheInit(ClientContext &context,
                                                                 TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBExternalFileCacheData>();
	result->entries = ExternalFileCache::Get(context).GetCachedFileInformation();
	return std::move(result);
}